

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

void __thiscall
Assimp::BlenderImporter::ConvertBlendFile
          (BlenderImporter *this,aiScene *out,Scene *in,FileDatabase *file)

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  undefined8 uVar4;
  pointer ppaVar5;
  pointer ppaVar6;
  pointer ppaVar7;
  pointer ppaVar8;
  pointer ppaVar9;
  uint uVar10;
  element_type *peVar11;
  element_type *peVar12;
  aiNode *this_00;
  aiNode **__s;
  long lVar13;
  aiNode *paVar14;
  aiMesh **__dest;
  aiLight **__dest_00;
  aiCamera **__dest_01;
  aiMaterial **__dest_02;
  aiTexture **__dest_03;
  Object **ppOVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  shared_ptr<Assimp::Blender::Base> cur;
  deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
  no_parents;
  ConversionData conv;
  element_type *local_228;
  undefined1 local_220 [12];
  float fStack_214;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_210;
  undefined8 uStack_200;
  float local_1f8;
  undefined8 local_1f4;
  undefined8 uStack_1ec;
  float local_1e4;
  BlenderImporter *local_1e0;
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
  local_1d8;
  ConversionData local_180;
  
  local_1e0 = this;
  Blender::ConversionData::ConversionData(&local_180,file);
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  _M_initialize_map(&local_1d8,0);
  peVar11 = (in->base).first.
            super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_220._0_4_ = SUB84(peVar11,0);
  local_220._4_4_ = (undefined4)((ulong)peVar11 >> 0x20);
  p_Var2 = (in->base).first.
           super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  local_220._8_4_ = SUB84(p_Var2,0);
  fStack_214 = (float)((ulong)p_Var2 >> 0x20);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  if (peVar11 != (element_type *)0x0) {
    do {
      peVar3 = (element_type *)peVar11[2].dna_type;
      if (peVar3 != (element_type *)0x0) {
        local_228 = peVar3;
        if (peVar3->parent == (Object *)0x0) {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::
            deque<Assimp::Blender::Object_const*,std::allocator<Assimp::Blender::Object_const*>>::
            _M_push_back_aux<Assimp::Blender::Object_const*>
                      ((deque<Assimp::Blender::Object_const*,std::allocator<Assimp::Blender::Object_const*>>
                        *)&local_1d8,&local_228);
          }
          else {
            *local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = peVar3;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
        else {
          std::
          _Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
          ::_M_insert_unique<Assimp::Blender::Object_const*>
                    ((_Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
                      *)&local_180,&local_228);
        }
      }
      lVar18 = CONCAT44(local_220._4_4_,local_220._0_4_);
      uVar4 = *(undefined8 *)(lVar18 + 0x18);
      local_220._0_4_ = (undefined4)uVar4;
      local_220._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_220 + 8),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar18 + 0x20));
      peVar11 = (element_type *)CONCAT44(local_220._4_4_,local_220._0_4_);
    } while (peVar11 != (element_type *)0x0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(fStack_214,local_220._8_4_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(fStack_214,local_220._8_4_))
    ;
  }
  peVar12 = (in->basact).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_220._0_4_ = SUB84(peVar12,0);
  local_220._4_4_ = (undefined4)((ulong)peVar12 >> 0x20);
  p_Var2 = (in->basact).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  local_220._8_4_ = SUB84(p_Var2,0);
  fStack_214 = (float)((ulong)p_Var2 >> 0x20);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  if (peVar12 != (element_type *)0x0) {
    do {
      peVar3 = (peVar12->object).
               super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) && (peVar3->parent != (Object *)0x0)) {
        local_228 = peVar3;
        std::
        _Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
        ::_M_insert_unique<Assimp::Blender::Object_const*>
                  ((_Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
                    *)&local_180,&local_228);
      }
      lVar18 = CONCAT44(local_220._4_4_,local_220._0_4_);
      uVar4 = *(undefined8 *)(lVar18 + 0x18);
      local_220._0_4_ = (undefined4)uVar4;
      local_220._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_220 + 8),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar18 + 0x20));
      peVar12 = (element_type *)CONCAT44(local_220._4_4_,local_220._0_4_);
    } while (peVar12 != (element_type *)0x0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(fStack_214,local_220._8_4_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(fStack_214,local_220._8_4_))
    ;
  }
  if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_220._0_8_ = &aStack_210;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_220,"Expected at least one object with no parent","");
    LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._0_8_ != &aStack_210) {
      operator_delete((void *)local_220._0_8_);
    }
  }
  this_00 = (aiNode *)operator_new(0x478);
  local_220._0_8_ = &aStack_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"<BlenderRoot>","");
  aiNode::aiNode(this_00,(string *)local_220);
  out->mRootNode = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._0_8_ != &aStack_210) {
    operator_delete((void *)local_220._0_8_);
  }
  uVar10 = (int)((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           (int)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                 (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((int)((ulong)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1
           + (uint)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
           ) * 0x40;
  this_00->mNumChildren = uVar10;
  uVar17 = (ulong)uVar10 << 3;
  __s = (aiNode **)operator_new__(uVar17);
  memset(__s,0,uVar17);
  this_00->mChildren = __s;
  if (this_00->mNumChildren != 0) {
    lVar18 = 0;
    uVar17 = 0;
    do {
      lVar13 = (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur -
               (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
      uVar1 = lVar13 + uVar17;
      if (uVar1 < 0x40) {
        ppOVar15 = (Object **)
                   ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur + lVar18);
      }
      else {
        uVar16 = (uVar1 >> 6) + 0xfc00000000000000;
        if (0 < (long)uVar1) {
          uVar16 = uVar1 >> 6;
        }
        ppOVar15 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node[uVar16] +
                   lVar13 + uVar16 * -0x40 + uVar17;
      }
      local_220._0_4_ = 1.0;
      local_220._4_4_ = 0.0;
      local_220._8_4_ = 0.0;
      fStack_214 = 0.0;
      aStack_210._M_allocated_capacity._0_4_ = 0;
      aStack_210._M_allocated_capacity._4_4_ = 0x3f800000;
      aStack_210._8_8_ = 0;
      uStack_200._0_4_ = 0.0;
      uStack_200._4_4_ = 0.0;
      local_1f8 = 1.0;
      local_1f4._0_4_ = 0.0;
      local_1f4._4_4_ = 0.0;
      uStack_1ec._0_4_ = 0.0;
      uStack_1ec._4_4_ = 0.0;
      local_1e4 = 1.0;
      paVar14 = ConvertNode(local_1e0,in,*ppOVar15,&local_180,(aiMatrix4x4 *)local_220);
      *(aiNode **)((long)this_00->mChildren + lVar18) = paVar14;
      *(aiNode **)(*(long *)((long)this_00->mChildren + lVar18) + 0x448) = this_00;
      uVar17 = uVar17 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar17 < this_00->mNumChildren);
  }
  BuildMaterials(local_1e0,&local_180);
  ppaVar5 = local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar17 = (long)local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (uVar17 != 0) {
    out->mNumMeshes = (uint)(uVar17 >> 3);
    __dest = (aiMesh **)operator_new__(uVar17 & 0x7fffffff8);
    out->mMeshes = __dest;
    if (ppaVar5 !=
        local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      memmove(__dest,local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,uVar17);
      local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  ppaVar7 = local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar17 = (long)local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (uVar17 != 0) {
    out->mNumLights = (uint)(uVar17 >> 3);
    __dest_00 = (aiLight **)operator_new__(uVar17 & 0x7fffffff8);
    out->mLights = __dest_00;
    if (ppaVar7 !=
        local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      memmove(__dest_00,
              local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl
              .super__Vector_impl_data._M_start,uVar17);
      local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  ppaVar6 = local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar17 = (long)local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (uVar17 != 0) {
    out->mNumCameras = (uint)(uVar17 >> 3);
    __dest_01 = (aiCamera **)operator_new__(uVar17 & 0x7fffffff8);
    out->mCameras = __dest_01;
    if (ppaVar6 !=
        local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      memmove(__dest_01,
              local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
              _M_impl.super__Vector_impl_data._M_start,uVar17);
      local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl
           .super__Vector_impl_data._M_start;
    }
  }
  ppaVar8 = local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar17 = (long)local_180.materials.arr.
                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_180.materials.arr.
                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar17 != 0) {
    out->mNumMaterials = (uint)(uVar17 >> 3);
    __dest_02 = (aiMaterial **)operator_new__(uVar17 & 0x7fffffff8);
    out->mMaterials = __dest_02;
    if (ppaVar8 !=
        local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      memmove(__dest_02,
              local_180.materials.arr.
              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_start,uVar17);
      local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
  }
  ppaVar9 = local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar17 = (long)local_180.textures.arr.
                 super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_180.textures.arr.
                 super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar17 != 0) {
    out->mNumTextures = (uint)(uVar17 >> 3);
    __dest_03 = (aiTexture **)operator_new__(uVar17 & 0x7fffffff8);
    out->mTextures = __dest_03;
    if (ppaVar9 !=
        local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl
        .super__Vector_impl_data._M_start) {
      memmove(__dest_03,
              local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
              _M_impl.super__Vector_impl_data._M_start,uVar17);
      local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
  }
  if (out->mNumMeshes == 0) {
    *(byte *)&out->mFlags = (byte)out->mFlags | 1;
  }
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  ~_Deque_base(&local_1d8);
  std::
  deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
  ::~deque(&local_180.materials_raw);
  Blender::TempArray<std::vector,_aiTexture>::~TempArray(&local_180.textures);
  Blender::TempArray<std::vector,_aiMaterial>::~TempArray(&local_180.materials);
  Blender::TempArray<std::vector,_aiLight>::~TempArray(&local_180.lights);
  Blender::TempArray<std::vector,_aiCamera>::~TempArray(&local_180.cameras);
  Blender::TempArray<std::vector,_aiMesh>::~TempArray(&local_180.meshes);
  std::
  _Rb_tree<const_Assimp::Blender::Object_*,_const_Assimp::Blender::Object_*,_std::_Identity<const_Assimp::Blender::Object_*>,_Assimp::Blender::ObjectCompare,_std::allocator<const_Assimp::Blender::Object_*>_>
  ::~_Rb_tree((_Rb_tree<const_Assimp::Blender::Object_*,_const_Assimp::Blender::Object_*,_std::_Identity<const_Assimp::Blender::Object_*>,_Assimp::Blender::ObjectCompare,_std::allocator<const_Assimp::Blender::Object_*>_>
               *)&local_180);
  return;
}

Assistant:

void BlenderImporter::ConvertBlendFile(aiScene* out, const Scene& in,const FileDatabase& file)
{
    ConversionData conv(file);

    // FIXME it must be possible to take the hierarchy directly from
    // the file. This is terrible. Here, we're first looking for
    // all objects which don't have parent objects at all -
    std::deque<const Object*> no_parents;
    for (std::shared_ptr<Base> cur = std::static_pointer_cast<Base> ( in.base.first ); cur; cur = cur->next) {
        if (cur->object) {
            if(!cur->object->parent) {
                no_parents.push_back(cur->object.get());
            } else {
                conv.objects.insert( cur->object.get() );
            }
        }
    }
    for (std::shared_ptr<Base> cur = in.basact; cur; cur = cur->next) {
        if (cur->object) {
            if(cur->object->parent) {
                conv.objects.insert(cur->object.get());
            }
        }
    }

    if (no_parents.empty()) {
        ThrowException("Expected at least one object with no parent");
    }

    aiNode* root = out->mRootNode = new aiNode("<BlenderRoot>");

    root->mNumChildren = static_cast<unsigned int>(no_parents.size());
    root->mChildren = new aiNode*[root->mNumChildren]();
    for (unsigned int i = 0; i < root->mNumChildren; ++i) {
        root->mChildren[i] = ConvertNode(in, no_parents[i], conv, aiMatrix4x4());
        root->mChildren[i]->mParent = root;
    }

    BuildMaterials(conv);

    if (conv.meshes->size()) {
        out->mMeshes = new aiMesh*[out->mNumMeshes = static_cast<unsigned int>( conv.meshes->size() )];
        std::copy(conv.meshes->begin(),conv.meshes->end(),out->mMeshes);
        conv.meshes.dismiss();
    }

    if (conv.lights->size()) {
        out->mLights = new aiLight*[out->mNumLights = static_cast<unsigned int>( conv.lights->size() )];
        std::copy(conv.lights->begin(),conv.lights->end(),out->mLights);
        conv.lights.dismiss();
    }

    if (conv.cameras->size()) {
        out->mCameras = new aiCamera*[out->mNumCameras = static_cast<unsigned int>( conv.cameras->size() )];
        std::copy(conv.cameras->begin(),conv.cameras->end(),out->mCameras);
        conv.cameras.dismiss();
    }

    if (conv.materials->size()) {
        out->mMaterials = new aiMaterial*[out->mNumMaterials = static_cast<unsigned int>( conv.materials->size() )];
        std::copy(conv.materials->begin(),conv.materials->end(),out->mMaterials);
        conv.materials.dismiss();
    }

    if (conv.textures->size()) {
        out->mTextures = new aiTexture*[out->mNumTextures = static_cast<unsigned int>( conv.textures->size() )];
        std::copy(conv.textures->begin(),conv.textures->end(),out->mTextures);
        conv.textures.dismiss();
    }

    // acknowledge that the scene might come out incomplete
    // by Assimp's definition of `complete`: blender scenes
    // can consist of thousands of cameras or lights with
    // not a single mesh between them.
    if (!out->mNumMeshes) {
        out->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }
}